

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall
flatbuffers::Parser::TryTypedValue(Parser *this,int dtoken,bool check,Value *e,BaseType req)

{
  int iVar1;
  undefined8 extraout_RAX;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = this->token_;
  if (iVar1 == dtoken) {
    std::__cxx11::string::_M_assign((string *)&e->constant);
    if (!check) {
      if ((e->type).base_type != BASE_TYPE_NONE) {
        std::__cxx11::string::string((string *)&local_50,"type mismatch: expecting: ",&local_b1);
        std::operator+(&local_b0,&local_50,*(char **)(kTypeNames + (ulong)(e->type).base_type * 8));
        std::operator+(&local_90,&local_b0,", found: ");
        std::operator+(&local_70,&local_90,*(char **)(kTypeNames + (ulong)req * 8));
        Error(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        _Unwind_Resume(extraout_RAX);
      }
      (e->type).base_type = req;
    }
    Next(this);
  }
  return iVar1 == dtoken;
}

Assistant:

bool Parser::TryTypedValue(int dtoken,
                           bool check,
                           Value &e,
                           BaseType req) {
  bool match = dtoken == token_;
  if (match) {
    e.constant = attribute_;
    if (!check) {
      if (e.type.base_type == BASE_TYPE_NONE) {
        e.type.base_type = req;
      } else {
        Error(std::string("type mismatch: expecting: ") +
              kTypeNames[e.type.base_type] +
              ", found: " +
              kTypeNames[req]);
      }
    }
    Next();
  }
  return match;
}